

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O3

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromInsert
          (CopyPropagateArrays *this,Instruction *insert_inst)

{
  IRContext *this_00;
  DefUseManager *this_01;
  TypeManager *this_02;
  pointer pAVar1;
  pointer pAVar2;
  undefined4 uVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  short sVar6;
  uint32_t uVar7;
  undefined4 value;
  Type *type;
  Instruction *this_03;
  Instruction *in_RDX;
  uint uVar8;
  IRContext *this_04;
  AccessChainEntry current_last_access;
  AccessChainEntry last_access;
  undefined1 local_58 [8];
  _Any_data local_50;
  AccessChainEntry local_40;
  AccessChainEntry local_38;
  
  if (in_RDX->opcode_ != OpCompositeInsert) {
    __assert_fail("insert_inst->opcode() == spv::Op::OpCompositeInsert && \"Expecting an OpCompositeInsert instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x194,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromInsert(Instruction *)"
                 );
  }
  this_00 = *(IRContext **)&insert_inst->opcode_;
  sVar6 = (short)this_00->valid_analyses_;
  this_04 = this_00;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
    this_04 = *(IRContext **)&insert_inst->opcode_;
    sVar6 = (short)this_04->valid_analyses_;
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if (-1 < sVar6) {
    IRContext::BuildTypeManager(this_04);
  }
  this_02 = (this_04->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  uVar7 = 0;
  if (in_RDX->has_type_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(in_RDX,0);
  }
  type = analysis::TypeManager::GetType(this_02,uVar7);
  uVar7 = anon_unknown_0::GetNumberOfMembers(type,*(IRContext **)&insert_inst->opcode_);
  if (uVar7 != 0) {
    uVar8 = (in_RDX->has_result_id_ & 1) + 1;
    if (in_RDX->has_type_id_ == false) {
      uVar8 = (uint)in_RDX->has_result_id_;
    }
    if (((int)((ulong)((long)(in_RDX->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(in_RDX->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar8
         == 3) && (value = Instruction::GetSingleWordOperand(in_RDX,uVar8 + 2), value == uVar7 - 1))
    {
      uVar7 = (in_RDX->has_result_id_ & 1) + 1;
      if (in_RDX->has_type_id_ == false) {
        uVar7 = (uint)in_RDX->has_result_id_;
      }
      Instruction::GetSingleWordOperand(in_RDX,uVar7);
      GetSourceObjectIfAny((CopyPropagateArrays *)&local_50,(uint32_t)insert_inst);
      if ((MemoryObject *)local_50._M_unused._0_8_ != (MemoryObject *)0x0) {
        if ((((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
               *)(local_50._M_unused._M_function_pointer + 8))->
            super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
            )._M_impl.super__Vector_impl_data._M_start ==
            *(pointer *)(local_50._M_unused._M_function_pointer + 0x10)) {
          (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
        }
        else {
          local_38 = (*(pointer *)(local_50._M_unused._M_function_pointer + 0x10))[-1];
          bVar5 = IsAccessChainIndexValidAndEqualTo
                            ((CopyPropagateArrays *)insert_inst,&local_38,value);
          if (bVar5) {
            if ((((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   *)(local_50._M_unused._M_function_pointer + 8))->
                super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                )._M_impl.super__Vector_impl_data._M_start ==
                *(pointer *)(local_50._M_unused._M_function_pointer + 0x10)) {
              __assert_fail("IsMember()",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.h"
                            ,0x5f,
                            "void spvtools::opt::CopyPropagateArrays::MemoryObject::PopIndirection()"
                           );
            }
            *(pointer *)(local_50._M_unused._M_function_pointer + 0x10) =
                 *(pointer *)(local_50._M_unused._M_function_pointer + 0x10) + -1;
            uVar8 = (in_RDX->has_result_id_ & 1) + 1;
            if (in_RDX->has_type_id_ == false) {
              uVar8 = (uint)in_RDX->has_result_id_;
            }
            uVar7 = Instruction::GetSingleWordOperand(in_RDX,uVar8 + 1);
            this_03 = analysis::DefUseManager::GetDef(this_01,uVar7);
            uVar3 = value;
            while( true ) {
              if (uVar3 == 0) {
                (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)local_50._M_unused._0_8_
                ;
                return (unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        )this;
              }
              if (this_03->opcode_ != OpCompositeInsert) goto LAB_0054baf2;
              uVar8 = (this_03->has_result_id_ & 1) + 1;
              if (this_03->has_type_id_ == false) {
                uVar8 = (uint)this_03->has_result_id_;
              }
              if (((int)((ulong)((long)(this_03->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_03->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                   - uVar8 != 3) ||
                 (local_50._12_4_ = Instruction::GetSingleWordOperand(this_03,uVar8 + 2),
                 local_50._12_4_ != value - 1)) goto LAB_0054baf2;
              uVar7 = (this_03->has_result_id_ & 1) + 1;
              if (this_03->has_type_id_ == false) {
                uVar7 = (uint)this_03->has_result_id_;
              }
              Instruction::GetSingleWordOperand(this_03,uVar7);
              GetSourceObjectIfAny((CopyPropagateArrays *)local_58,(uint32_t)insert_inst);
              auVar4 = local_58;
              if (local_58 == (undefined1  [8])0x0) goto LAB_0054baf2;
              pAVar1 = (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                          *)((long)local_58 + 8))->
                       super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pAVar2 = (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                          *)((long)local_58 + 8))->
                       super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              if (((pAVar1 == pAVar2) ||
                  (((long)*(pointer *)(local_50._M_unused._M_function_pointer + 0x10) -
                    (long)(((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                             *)(local_50._M_unused._M_function_pointer + 8))->
                          super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) + 1 !=
                   (long)pAVar2 - (long)pAVar1 >> 3)) ||
                 (bVar5 = MemoryObject::Contains
                                    ((MemoryObject *)local_50._M_unused._0_8_,
                                     (MemoryObject *)local_58), value = local_50._12_4_, !bVar5))
              break;
              local_40 = pAVar2[-1];
              bVar5 = IsAccessChainIndexValidAndEqualTo
                                ((CopyPropagateArrays *)insert_inst,&local_40,local_50._12_4_);
              if (!bVar5) {
                (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
                if (local_58 != (undefined1  [8])0x0) goto LAB_0054bb25;
                goto LAB_0054baf9;
              }
              uVar8 = (this_03->has_result_id_ & 1) + 1;
              if (this_03->has_type_id_ == false) {
                uVar8 = (uint)this_03->has_result_id_;
              }
              uVar7 = Instruction::GetSingleWordOperand(this_03,uVar8 + 1);
              this_03 = analysis::DefUseManager::GetDef(this_01,uVar7);
              uVar3 = local_50._12_4_;
              if (local_58 != (undefined1  [8])0x0) {
                std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
                          ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)
                           local_58,(MemoryObject *)local_58);
                uVar3 = local_50._12_4_;
              }
            }
            (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
            local_58 = auVar4;
LAB_0054bb25:
            std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
                      ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)local_58,
                       (MemoryObject *)local_58);
          }
          else {
LAB_0054baf2:
            (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
          }
LAB_0054baf9:
          if ((MemoryObject *)local_50._M_unused._0_8_ == (MemoryObject *)0x0) {
            return (unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                    )this;
          }
        }
        std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
                  ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)&local_50,
                   (MemoryObject *)local_50._M_unused._0_8_);
        return (unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                )this;
      }
    }
  }
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromInsert(Instruction* insert_inst) {
  assert(insert_inst->opcode() == spv::Op::OpCompositeInsert &&
         "Expecting an OpCompositeInsert instruction.");

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* result_type = type_mgr->GetType(insert_inst->type_id());

  uint32_t number_of_elements = GetNumberOfMembers(result_type, context());

  if (number_of_elements == 0) {
    return nullptr;
  }

  if (insert_inst->NumInOperands() != 3) {
    return nullptr;
  }

  if (insert_inst->GetSingleWordInOperand(2) != number_of_elements - 1) {
    return nullptr;
  }

  std::unique_ptr<MemoryObject> memory_object =
      GetSourceObjectIfAny(insert_inst->GetSingleWordInOperand(0));

  if (!memory_object) {
    return nullptr;
  }

  if (!memory_object->IsMember()) {
    return nullptr;
  }

  AccessChainEntry last_access = memory_object->AccessChain().back();
  if (!IsAccessChainIndexValidAndEqualTo(last_access, number_of_elements - 1)) {
    return nullptr;
  }

  memory_object->PopIndirection();

  Instruction* current_insert =
      def_use_mgr->GetDef(insert_inst->GetSingleWordInOperand(1));
  for (uint32_t i = number_of_elements - 1; i > 0; --i) {
    if (current_insert->opcode() != spv::Op::OpCompositeInsert) {
      return nullptr;
    }

    if (current_insert->NumInOperands() != 3) {
      return nullptr;
    }

    if (current_insert->GetSingleWordInOperand(2) != i - 1) {
      return nullptr;
    }

    std::unique_ptr<MemoryObject> current_memory_object =
        GetSourceObjectIfAny(current_insert->GetSingleWordInOperand(0));

    if (!current_memory_object) {
      return nullptr;
    }

    if (!current_memory_object->IsMember()) {
      return nullptr;
    }

    if (memory_object->AccessChain().size() + 1 !=
        current_memory_object->AccessChain().size()) {
      return nullptr;
    }

    if (!memory_object->Contains(current_memory_object.get())) {
      return nullptr;
    }

    AccessChainEntry current_last_access =
        current_memory_object->AccessChain().back();
    if (!IsAccessChainIndexValidAndEqualTo(current_last_access, i - 1)) {
      return nullptr;
    }
    current_insert =
        def_use_mgr->GetDef(current_insert->GetSingleWordInOperand(1));
  }

  return memory_object;
}